

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_current_line(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,render_handler *handler,
                   context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *ctx,component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *comp)

{
  bool bVar1;
  
  if ((ctx->line_buffer).contained_section_tag == true) {
    bVar1 = line_buffer_state<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::is_empty_or_contains_only_whitespace(&ctx->line_buffer);
    if (bVar1) goto LAB_001e7a42;
  }
  Catch::clara::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(handler,&(ctx->line_buffer).data);
  if (comp != (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
    Catch::clara::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(handler,&comp->text);
  }
LAB_001e7a42:
  (ctx->line_buffer).data._M_string_length = 0;
  *(ctx->line_buffer).data._M_dataplus._M_p = '\0';
  (ctx->line_buffer).contained_section_tag = false;
  return;
}

Assistant:

void render_current_line(const render_handler& handler, context_internal<string_type>& ctx, const component<string_type>* comp) const {
        // We're at the end of a line, so check the line buffer state to see
        // if the line had tags in it, and also if the line is now empty or
        // contains whitespace only. if this situation is true, skip the line.
        bool output = true;
        if (ctx.line_buffer.contained_section_tag && ctx.line_buffer.is_empty_or_contains_only_whitespace()) {
            output = false;
        }
        if (output) {
            handler(ctx.line_buffer.data);
            if (comp) {
                handler(comp->text);
            }
        }
        ctx.line_buffer.clear();
    }